

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O3

exr_result_t exr_attr_opaquedata_destroy(exr_context_t ctxt,exr_attr_opaquedata_t *ud)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = 0;
    if (ud != (exr_attr_opaquedata_t *)0x0) {
      if ((ud->packed_data != (void *)0x0) && (0 < ud->packed_alloc_size)) {
        (*ctxt->free_fn)(ud->packed_data);
      }
      if ((ud->unpacked_data != (void *)0x0) &&
         (ud->destroy_unpacked_func_ptr != (_func_void_exr_context_t_void_ptr_int32_t *)0x0)) {
        (*ud->destroy_unpacked_func_ptr)(ctxt,ud->unpacked_data,ud->unpacked_size);
      }
      ud->unpack_func_ptr =
           (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
      ud->pack_func_ptr =
           (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0;
      ud->packed_data = (void *)0x0;
      ud->unpacked_data = (void *)0x0;
      ud->size = 0;
      ud->unpacked_size = 0;
      ud->packed_alloc_size = 0;
      ud->pad[0] = '\0';
      ud->pad[1] = '\0';
      ud->pad[2] = '\0';
      ud->pad[3] = '\0';
      ud->destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
      eVar1 = 0;
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_opaquedata_destroy (exr_context_t ctxt, exr_attr_opaquedata_t* ud)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (ud)
    {
        exr_attr_opaquedata_t nil = {0};
        if (ud->packed_data && ud->packed_alloc_size > 0)
            ctxt->free_fn (ud->packed_data);

        if (ud->unpacked_data && ud->destroy_unpacked_func_ptr)
            ud->destroy_unpacked_func_ptr (
                ctxt, ud->unpacked_data, ud->unpacked_size);
        *ud = nil;
    }
    return EXR_ERR_SUCCESS;
}